

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

block * gen_geneve(compiler_state_t *cstate,int vni)

{
  uint uVar1;
  u_int uVar2;
  int iVar3;
  block *pbVar4;
  slist *psVar5;
  slist *psVar6;
  block *b1;
  block *b1_00;
  slist *psVar7;
  
  pbVar4 = gen_geneve_check(cstate,gen_port,OR_TRAN_IPV4,vni);
  psVar5 = gen_loadx_iphdrlen(cstate);
  psVar6 = new_stmt(cstate,0x87);
  sappend(psVar6,psVar6);
  b1 = new_block(cstate,0x1d);
  b1->stmts = psVar5;
  (b1->s).k = 0;
  gen_and(pbVar4,b1);
  pbVar4 = gen_geneve_check(cstate,gen_port6,OR_TRAN_IPV6,vni);
  psVar6 = gen_abs_offset_varpart(cstate,&cstate->off_linkpl);
  psVar5 = new_stmt(cstate,0);
  (psVar5->s).k = 0x28;
  if (psVar6 != (slist *)0x0) {
    sappend(psVar5,psVar5);
    psVar5 = new_stmt(cstate,0xc);
    (psVar5->s).k = 0;
    sappend(psVar5,psVar5);
    psVar5 = psVar6;
  }
  psVar6 = new_stmt(cstate,7);
  sappend(psVar6,psVar6);
  b1_00 = new_block(cstate,0x1d);
  b1_00->stmts = psVar5;
  (b1_00->s).k = 0;
  gen_and(pbVar4,b1_00);
  gen_or(b1,b1_00);
  psVar5 = new_stmt(cstate,4);
  (psVar5->s).k = (cstate->off_linkpl).constant_part + cstate->off_nl + 8;
  psVar6 = new_stmt(cstate,7);
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,4);
  (psVar6->s).k = 2;
  sappend(psVar6,psVar6);
  iVar3 = alloc_reg(cstate);
  (cstate->off_linktype).reg = iVar3;
  (cstate->off_linktype).is_variable = 1;
  (cstate->off_linktype).constant_part = 0;
  psVar6 = new_stmt(cstate,2);
  (psVar6->s).k = (cstate->off_linktype).reg;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,0x50);
  (psVar6->s).k = 0;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,0x54);
  (psVar6->s).k = 0x3f;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,0x24);
  (psVar6->s).k = 4;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,4);
  (psVar6->s).k = 8;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,0xc);
  (psVar6->s).k = 0;
  sappend(psVar6,psVar6);
  cstate->prevlinktype = cstate->linktype;
  uVar2 = (cstate->off_linkhdr).constant_part;
  (cstate->off_prevlinkhdr).is_variable = (cstate->off_linkhdr).is_variable;
  (cstate->off_prevlinkhdr).constant_part = uVar2;
  (cstate->off_prevlinkhdr).reg = (cstate->off_linkhdr).reg;
  cstate->linktype = 1;
  (cstate->off_linkhdr).is_variable = 1;
  (cstate->off_linkhdr).constant_part = 0;
  iVar3 = alloc_reg(cstate);
  (cstate->off_linkhdr).reg = iVar3;
  cstate->is_geneve = 0;
  psVar6 = new_stmt(cstate,2);
  (psVar6->s).k = (cstate->off_linkhdr).reg;
  sappend(psVar6,psVar6);
  cstate->no_optimize = 1;
  psVar6 = new_stmt(cstate,0x48);
  (psVar6->s).k = 2;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,0x61);
  (psVar6->s).k = (cstate->off_linkhdr).reg;
  sappend(psVar6,psVar6);
  psVar6 = new_stmt(cstate,0x15);
  (psVar6->s).k = 0x6558;
  sappend(psVar6,psVar6);
  psVar7 = new_stmt(cstate,0x87);
  sappend(psVar7,psVar7);
  (psVar6->s).jt = psVar7;
  psVar7 = new_stmt(cstate,4);
  (psVar7->s).k = 0xc;
  sappend(psVar7,psVar7);
  psVar7 = new_stmt(cstate,2);
  (psVar7->s).k = (cstate->off_linktype).reg;
  sappend(psVar7,psVar7);
  psVar7 = new_stmt(cstate,4);
  (psVar7->s).k = 2;
  sappend(psVar7,psVar7);
  psVar7 = new_stmt(cstate,7);
  sappend(psVar7,psVar7);
  iVar3 = alloc_reg(cstate);
  (cstate->off_linkpl).reg = iVar3;
  (cstate->off_linkpl).is_variable = 1;
  (cstate->off_linkpl).constant_part = 0;
  psVar7 = new_stmt(cstate,3);
  uVar1 = (cstate->off_linkpl).reg;
  (psVar7->s).k = uVar1;
  sappend((slist *)(ulong)uVar1,psVar7);
  (psVar6->s).jf = psVar7;
  cstate->off_nl = 0;
  pbVar4 = gen_true(cstate);
  sappend((slist *)pbVar4,pbVar4->stmts);
  pbVar4->stmts = psVar5;
  gen_and(b1_00,pbVar4);
  cstate->is_geneve = 1;
  return pbVar4;
}

Assistant:

struct block *
gen_geneve(compiler_state_t *cstate, int vni)
{
	struct block *b0, *b1;
	struct slist *s;

	b0 = gen_geneve4(cstate, vni);
	b1 = gen_geneve6(cstate, vni);

	gen_or(b0, b1);
	b0 = b1;

	/* Later filters should act on the payload of the Geneve frame,
	 * update all of the header pointers. Attach this code so that
	 * it gets executed in the event that the Geneve filter matches. */
	s = gen_geneve_offsets(cstate);

	b1 = gen_true(cstate);
	sappend(s, b1->stmts);
	b1->stmts = s;

	gen_and(b0, b1);

	cstate->is_geneve = 1;

	return b1;
}